

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void cdef_row_mt_sync_write(AV1CdefSync *cdef_sync,int row)

{
  AV1CdefRowSync *pAVar1;
  
  pAVar1 = cdef_sync->cdef_row_mt;
  pthread_mutex_lock((pthread_mutex_t *)pAVar1[row].row_mutex_);
  pthread_cond_signal((pthread_cond_t *)pAVar1[row].row_cond_);
  pAVar1[row].is_row_done = 1;
  pthread_mutex_unlock((pthread_mutex_t *)pAVar1[row].row_mutex_);
  return;
}

Assistant:

static inline void cdef_row_mt_sync_write(AV1CdefSync *const cdef_sync,
                                          int row) {
#if CONFIG_MULTITHREAD
  AV1CdefRowSync *const cdef_row_mt = cdef_sync->cdef_row_mt;
  pthread_mutex_lock(cdef_row_mt[row].row_mutex_);
  pthread_cond_signal(cdef_row_mt[row].row_cond_);
  cdef_row_mt[row].is_row_done = 1;
  pthread_mutex_unlock(cdef_row_mt[row].row_mutex_);
#else
  (void)cdef_sync;
  (void)row;
#endif  // CONFIG_MULTITHREAD
}